

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_50934::createDFDCompressedTest1x16_FormatASTC_10x5_SRGB_Test::TestBody
          (createDFDCompressedTest1x16_FormatASTC_10x5_SRGB_Test *this)

{
  createDFDTestBaseComp<1U,_16U> *pcVar1;
  int iVar2;
  uint *lhs;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  *(ulong *)&(this->super_createDFDCompressedTest1x16).super_createDFDTestBaseComp<1U,_16U>.
             super_createDFDTestBase<1U,_16U>.expected.field_0x8 =
       (ulong)(byte)(this->super_createDFDCompressedTest1x16).super_createDFDTestBaseComp<1U,_16U>.
                    super_createDFDTestBase<1U,_16U>.expected.field_0xf << 0x38 | 0x409000201a2;
  *(undefined8 *)
   (this->super_createDFDCompressedTest1x16).super_createDFDTestBaseComp<1U,_16U>.
   super_createDFDTestBase<1U,_16U>.expected.samples = 0x7f0000;
  pcVar1 = &(this->super_createDFDCompressedTest1x16).super_createDFDTestBaseComp<1U,_16U>;
  (pcVar1->super_createDFDTestBase<1U,_16U>).expected.samples[0].lower = 0;
  (pcVar1->super_createDFDTestBase<1U,_16U>).expected.samples[0].upper = 0xffffffff;
  lhs = (uint *)createDFDCompressed(0xd,10,5,1,8);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_28,"*dfd","sizeof(expected) + 4U",lhs,(unsigned_long *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x260,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  iVar2 = memcmp(&(this->super_createDFDCompressedTest1x16).super_createDFDTestBaseComp<1U,_16U>.
                  super_createDFDTestBase<1U,_16U>.expected,lhs + 1,0x28);
  local_38._M_head_impl._0_4_ = iVar2;
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"memcmp(&expected, dfd+1, sizeof(expected))","0",(int *)&local_38,
             (int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x261,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  free(lhs);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1x16, FormatASTC_10x5_SRGB) {
    customize(KHR_DF_MODEL_ASTC, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              9, 4,
              {
                {0, 127, KHR_DF_CHANNEL_ASTC_DATA, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ASTC, 10, 5, 1, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}